

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsRFC3927(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  array<unsigned_char,_2UL> local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV4) {
    local_a._M_elems[0] = 0xa9;
    local_a._M_elems[1] = 0xfe;
    bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,2ul>
                      (&this->m_addr,&local_a);
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC3927() const
{
    return IsIPv4() && HasPrefix(m_addr, std::array<uint8_t, 2>{169, 254});
}